

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::CopyStaticResources
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IPipelineResourceSignature *pDstSignature)

{
  bool bVar1;
  Char *pCVar2;
  undefined8 uVar3;
  char (*in_stack_ffffffffffffff48) [3];
  code *pcVar4;
  undefined1 local_98 [8];
  string _msg;
  PipelineResourceSignatureImplType *pDstSignImpl;
  PipelineResourceSignatureImplType *pThisImpl;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  IPipelineResourceSignature *pDstSignature_local;
  PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = pDstSignature;
  if (pDstSignature == (IPipelineResourceSignature *)0x0) {
    FormatString<char[39]>
              ((string *)local_38,(char (*) [39])"Destination signature must not be null");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CopyStaticResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x23d);
    std::__cxx11::string::~string((string *)local_38);
  }
  else if ((PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)pDstSignature == this) {
    FormatString<char[52]>
              ((string *)&pThisImpl,
               (char (*) [52])"Source and destination signatures must be different");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CopyStaticResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x243);
    std::__cxx11::string::~string((string *)&pThisImpl);
  }
  else {
    _msg.field_2._8_8_ = pDstSignature;
    bVar1 = IsCompatibleWith((PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *)
                             pDstSignature,(IPipelineResourceSignature *)this);
    if (bVar1) {
      PipelineResourceSignatureGLImpl::CopyStaticResources
                ((PipelineResourceSignatureGLImpl *)this,
                 *(ShaderResourceCacheGL **)(_msg.field_2._8_8_ + 0x88));
    }
    else {
      FormatString<char[71],char_const*,char[48],char_const*,char[3]>
                ((string *)local_98,
                 (Diligent *)
                 "Can\'t copy static resources: destination pipeline resource signature \'",
                 (char (*) [71])(_msg.field_2._8_8_ + 0x18),
                 (char **)"\' is not compatible with the source signature \'",
                 (char (*) [48])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                  ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff48);
      if (DebugMessageCallback != (undefined *)0x0) {
        pcVar4 = (code *)DebugMessageCallback;
        uVar3 = std::__cxx11::string::c_str();
        (*pcVar4)(2,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  return;
}

Assistant:

CopyStaticResources(IPipelineResourceSignature* pDstSignature) const override final
    {
        if (pDstSignature == nullptr)
        {
            DEV_ERROR("Destination signature must not be null");
            return;
        }

        if (pDstSignature == this)
        {
            DEV_ERROR("Source and destination signatures must be different");
            return;
        }

        const PipelineResourceSignatureImplType* const pThisImpl    = static_cast<const PipelineResourceSignatureImplType*>(this);
        const PipelineResourceSignatureImplType* const pDstSignImpl = static_cast<const PipelineResourceSignatureImplType*>(pDstSignature);
        if (!pDstSignImpl->IsCompatibleWith(pThisImpl))
        {
            LOG_ERROR_MESSAGE("Can't copy static resources: destination pipeline resource signature '", pDstSignImpl->m_Desc.Name,
                              "' is not compatible with the source signature '", pThisImpl->m_Desc.Name, "'.");
            return;
        }

        pThisImpl->CopyStaticResources(*pDstSignImpl->m_pStaticResCache);
    }